

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::avx::BVHNRefitter<4>::refit_toplevel
          (BBox3fa *__return_storage_ptr__,BVHNRefitter<4> *this,NodeRef *ref,size_t *subtrees,
          BBox3fa *subTreeBounds,size_t depth)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  AABBNode *node;
  long lVar15;
  BBox3fa bounds [4];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  if (depth < 4) {
    uVar3 = ref->ptr;
    if ((uVar3 & 0xf) == 0) {
      lVar15 = 0;
      do {
        if (*(long *)(uVar3 + lVar15) == 8) {
          lVar1 = lVar15 * 4;
          *(undefined4 *)(local_d8 + lVar1) = 0x7f800000;
          *(undefined4 *)(local_d8 + lVar1 + 4) = 0x7f800000;
          *(undefined4 *)(local_d8 + lVar1 + 8) = 0x7f800000;
          *(undefined4 *)(local_c8 + lVar1 + -4) = 0x7f800000;
          lVar1 = lVar15 * 4;
          *(undefined4 *)(local_c8 + lVar1) = 0xff800000;
          *(undefined4 *)(local_c8 + lVar1 + 4) = 0xff800000;
          *(undefined4 *)(local_c8 + lVar1 + 8) = 0xff800000;
          *(undefined4 *)(local_b8 + lVar1 + -4) = 0xff800000;
        }
        else {
          refit_toplevel((BBox3fa *)&local_58.field_1,this,(NodeRef *)(uVar3 + lVar15),subtrees,
                         subTreeBounds,depth + 1);
          lVar1 = lVar15 * 4;
          *(undefined8 *)(local_d8 + lVar1) = local_58._0_8_;
          *(undefined8 *)(local_d8 + lVar1 + 8) = local_58._8_8_;
          *(undefined8 *)(local_c8 + lVar1) = uStack_48;
          *(undefined8 *)(local_c8 + lVar1 + 8) = uStack_40;
        }
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x20);
      auVar8 = vunpcklps_avx(local_d8,local_98);
      auVar6 = vunpckhps_avx(local_d8,local_98);
      auVar9 = vunpcklps_avx(local_b8,local_78);
      auVar7 = vunpckhps_avx(local_b8,local_78);
      auVar10 = vunpcklps_avx(auVar6,auVar7);
      auVar11 = vunpcklps_avx(auVar8,auVar9);
      auVar6 = vunpckhps_avx(auVar8,auVar9);
      auVar9 = vunpcklps_avx(local_c8,local_88);
      auVar7 = vunpckhps_avx(local_c8,local_88);
      auVar12 = vunpcklps_avx(local_a8,local_68);
      auVar8 = vunpckhps_avx(local_a8,local_68);
      auVar8 = vunpcklps_avx(auVar7,auVar8);
      auVar13 = vunpcklps_avx(auVar9,auVar12);
      auVar7 = vunpckhps_avx(auVar9,auVar12);
      *(undefined1 (*) [16])(uVar3 + 0x20) = auVar11;
      *(undefined1 (*) [16])(uVar3 + 0x40) = auVar6;
      *(undefined1 (*) [16])(uVar3 + 0x60) = auVar10;
      *(undefined1 (*) [16])(uVar3 + 0x30) = auVar13;
      *(undefined1 (*) [16])(uVar3 + 0x50) = auVar7;
      *(undefined1 (*) [16])(uVar3 + 0x70) = auVar8;
      auVar6 = vminps_avx(local_d8,local_b8);
      auVar7 = vminps_avx(local_98,local_78);
      aVar5 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vminps_avx(auVar6,auVar7);
      auVar6 = vmaxps_avx(local_c8,local_a8);
      auVar7 = vmaxps_avx(local_88,local_68);
      aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vmaxps_avx(auVar6,auVar7);
      (__return_storage_ptr__->lower).field_0 = aVar5;
      (__return_storage_ptr__->upper).field_0 = aVar4;
    }
    else {
      (**this->leafBounds->_vptr_LeafBoundsInterface)(__return_storage_ptr__);
    }
  }
  else {
    sVar2 = *subtrees;
    *subtrees = sVar2 + 1;
    uVar14 = *(undefined8 *)((long)&subTreeBounds[sVar2].lower.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->lower).field_0 =
         *(undefined8 *)&subTreeBounds[sVar2].lower.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = uVar14;
    uVar14 = *(undefined8 *)((long)&subTreeBounds[sVar2].upper.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->upper).field_0 =
         *(undefined8 *)&subTreeBounds[sVar2].upper.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->upper).field_0 + 8) = uVar14;
  }
  return __return_storage_ptr__;
}

Assistant:

BBox3fa BVHNRefitter<N>::refit_toplevel(NodeRef& ref,
                                            size_t &subtrees,
                                            const BBox3fa *const subTreeBounds,
                                            const size_t depth)
    {
      if (depth >= MAX_SUB_TREE_EXTRACTION_DEPTH) 
      {
        assert(subtrees < MAX_NUM_SUB_TREES);
        assert(subTrees[subtrees] == ref);
        return subTreeBounds[subtrees++];
      }

      if (ref.isAABBNode())
      {
        AABBNode* node = ref.getAABBNode();
        BBox3fa bounds[N];

        for (size_t i=0; i<N; i++)
        {
          NodeRef& child = node->child(i);

          if (unlikely(child == BVH::emptyNode)) 
            bounds[i] = BBox3fa(empty);
          else
            bounds[i] = refit_toplevel(child,subtrees,subTreeBounds,depth+1); 
        }
        
        BBox3vf<N> boundsT = transpose<N>(bounds);
      
        /* set new bounds */
        node->lower_x = boundsT.lower.x;
        node->lower_y = boundsT.lower.y;
        node->lower_z = boundsT.lower.z;
        node->upper_x = boundsT.upper.x;
        node->upper_y = boundsT.upper.y;
        node->upper_z = boundsT.upper.z;
        
        return merge<N>(bounds);
      }
      else
        return leafBounds.leafBounds(ref);
    }